

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_params_for_cur_layer_frames
               (GF_GROUP *gf_group,FRAME_REORDER_INFO *arf_frame_stats,int *cur_frame_idx,
               int *cur_disp_idx,int *frame_ind,int *count_arf_frames,int *doh_gf_index_map,
               int num_dir,int node_start,int node_end,int layer_depth)

{
  undefined8 in_RCX;
  long in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  int *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int layer_with_parallel_encodes;
  int num_frames_to_process;
  int dir;
  int i;
  int end;
  int start;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff9c;
  GF_GROUP *in_stack_ffffffffffffffa0;
  int iVar1;
  int start_00;
  undefined4 local_44;
  
  for (; in_stack_00000018 < in_stack_00000020; in_stack_00000018 = in_stack_00000018 + 1) {
    for (iVar1 = 0; iVar1 < in_stack_00000010; iVar1 = iVar1 + 1) {
      if (iVar1 == 0) {
        local_44 = *(int *)(in_RSI + (long)in_stack_00000018 * 0xc);
        start_00 = *(int *)(in_RSI + (long)in_stack_00000018 * 0xc + 8);
      }
      else {
        local_44 = *(int *)(in_RSI + (long)in_stack_00000018 * 0xc + 8) + 1;
        start_00 = *(int *)(in_RSI + (long)in_stack_00000018 * 0xc + 4);
      }
      if (2 < start_00 - local_44) {
        set_params_for_internal_arfs_in_gf14
                  (in_stack_ffffffffffffffa0,
                   (FRAME_REORDER_INFO *)
                   CONCAT44(in_stack_ffffffffffffff9c,(uint)(in_stack_00000028 == 4)),
                   (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_00000028),
                   (int *)CONCAT44(in_stack_ffffffffffffff8c,start_00),
                   (int *)CONCAT44(in_stack_ffffffffffffff84,local_44),in_stack_00000008,
                   (int *)CONCAT44(in_stack_00000018,iVar1),start_00,(int)in_R9,(int)in_R8,
                   (int)in_RCX);
      }
    }
  }
  return;
}

Assistant:

static inline void set_params_for_cur_layer_frames(
    GF_GROUP *const gf_group, FRAME_REORDER_INFO *arf_frame_stats,
    int *cur_frame_idx, int *cur_disp_idx, int *frame_ind,
    int *count_arf_frames, int *doh_gf_index_map, int num_dir, int node_start,
    int node_end, int layer_depth) {
  assert(num_dir < 3);
  int start, end;
  // Iterate through the nodes in the previous layer depth.
  for (int i = node_start; i < node_end; i++) {
    // For each node, check if a frame can be coded as INTNL_ARF_UPDATE frame on
    // either direction.
    for (int dir = 0; dir < num_dir; dir++) {
      // Checks for a frame to the left of current node.
      if (dir == 0) {
        start = arf_frame_stats[i].start;
        end = arf_frame_stats[i].display_index;
      } else {
        // Checks for a frame to the right of current node.
        start = arf_frame_stats[i].display_index + 1;
        end = arf_frame_stats[i].end;
      }
      const int num_frames_to_process = end - start;
      // Checks if a frame can be coded as INTNL_ARF_UPDATE frame. If
      // num_frames_to_process is less than 3, then there are not enough frames
      // between 'start' and 'end' to create another level.
      if (num_frames_to_process >= 3) {
        // Flag to indicate the lower layer depths for which parallel encoding
        // is enabled. Currently enabled for layer 4 frames.
        int layer_with_parallel_encodes = layer_depth == 4;
        set_params_for_internal_arfs_in_gf14(
            gf_group, arf_frame_stats, cur_frame_idx, cur_disp_idx, frame_ind,
            count_arf_frames, doh_gf_index_map, start, end, layer_depth,
            layer_with_parallel_encodes);
      }
    }
  }
}